

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreParsingUtils.h
# Opt level: O3

string * Assimp::Ogre::Trim(string *s,bool newlines)

{
  byte *pbVar1;
  ulong uVar2;
  byte *pbVar3;
  long lVar4;
  byte *pbVar5;
  
  pbVar1 = (byte *)(s->_M_dataplus)._M_p;
  uVar2 = s->_M_string_length;
  pbVar3 = pbVar1;
  if (0 < (long)uVar2 >> 2) {
    lVar4 = ((long)uVar2 >> 2) + 1;
    pbVar5 = pbVar1 + 3;
    do {
      pbVar3 = pbVar5;
      if ((0x20 < (ulong)pbVar3[-3]) || ((0x100003601U >> ((ulong)pbVar3[-3] & 0x3f) & 1) == 0)) {
        pbVar3 = pbVar3 + -3;
        goto LAB_004af98e;
      }
      if ((0x20 < (ulong)pbVar3[-2]) || ((0x100003601U >> ((ulong)pbVar3[-2] & 0x3f) & 1) == 0)) {
        pbVar3 = pbVar3 + -2;
        goto LAB_004af98e;
      }
      if ((0x20 < (ulong)pbVar3[-1]) || ((0x100003601U >> ((ulong)pbVar3[-1] & 0x3f) & 1) == 0)) {
        pbVar3 = pbVar3 + -1;
        goto LAB_004af98e;
      }
      if ((0x20 < (ulong)*pbVar3) || ((0x100003601U >> ((ulong)*pbVar3 & 0x3f) & 1) == 0))
      goto LAB_004af98e;
      lVar4 = lVar4 + -1;
      pbVar5 = pbVar3 + 4;
      pbVar3 = pbVar1 + (uVar2 & 0xfffffffffffffffc);
    } while (1 < lVar4);
  }
  lVar4 = (long)(pbVar1 + uVar2) - (long)pbVar3;
  if (lVar4 == 1) {
LAB_004af961:
    if ((0x20 < (ulong)*pbVar3) || ((0x100003601U >> ((ulong)*pbVar3 & 0x3f) & 1) == 0))
    goto LAB_004af98e;
LAB_004af9a2:
    s->_M_string_length = 0;
    *pbVar1 = 0;
  }
  else {
    if (lVar4 == 2) {
LAB_004af945:
      if (((ulong)*pbVar3 < 0x21) && ((0x100003601U >> ((ulong)*pbVar3 & 0x3f) & 1) != 0)) {
        pbVar3 = pbVar3 + 1;
        goto LAB_004af961;
      }
    }
    else {
      if (lVar4 != 3) goto LAB_004af9a2;
      if (((ulong)*pbVar3 < 0x21) && ((0x100003601U >> ((ulong)*pbVar3 & 0x3f) & 1) != 0)) {
        pbVar3 = pbVar3 + 1;
        goto LAB_004af945;
      }
    }
LAB_004af98e:
    if (pbVar1 + uVar2 == pbVar3) goto LAB_004af9a2;
    std::__cxx11::string::_M_erase((ulong)s,0);
  }
  pbVar1 = (byte *)(s->_M_dataplus)._M_p;
  uVar2 = s->_M_string_length;
  pbVar3 = pbVar1;
  if (0 < (long)uVar2 >> 2) {
    lVar4 = ((long)uVar2 >> 2) + 1;
    pbVar5 = pbVar1 + 3;
    do {
      pbVar3 = pbVar5;
      if ((0x20 < (ulong)pbVar3[-3]) || ((0x100003601U >> ((ulong)pbVar3[-3] & 0x3f) & 1) == 0)) {
        pbVar3 = pbVar3 + -3;
        goto LAB_004afad3;
      }
      if ((0x20 < (ulong)pbVar3[-2]) || ((0x100003601U >> ((ulong)pbVar3[-2] & 0x3f) & 1) == 0)) {
        pbVar3 = pbVar3 + -2;
        goto LAB_004afad3;
      }
      if ((0x20 < (ulong)pbVar3[-1]) || ((0x100003601U >> ((ulong)pbVar3[-1] & 0x3f) & 1) == 0)) {
        pbVar3 = pbVar3 + -1;
        goto LAB_004afad3;
      }
      if ((0x20 < (ulong)*pbVar3) || ((0x100003601U >> ((ulong)*pbVar3 & 0x3f) & 1) == 0))
      goto LAB_004afad3;
      lVar4 = lVar4 + -1;
      pbVar5 = pbVar3 + 4;
      pbVar3 = pbVar1 + (uVar2 & 0xfffffffffffffffc);
    } while (1 < lVar4);
  }
  lVar4 = (long)(pbVar1 + uVar2) - (long)pbVar3;
  if (lVar4 == 1) {
LAB_004afaa6:
    if (((ulong)*pbVar3 < 0x21) && ((0x100003601U >> ((ulong)*pbVar3 & 0x3f) & 1) != 0))
    goto LAB_004afae7;
  }
  else if (lVar4 == 2) {
LAB_004afa8a:
    if (((ulong)*pbVar3 < 0x21) && ((0x100003601U >> ((ulong)*pbVar3 & 0x3f) & 1) != 0)) {
      pbVar3 = pbVar3 + 1;
      goto LAB_004afaa6;
    }
  }
  else {
    if (lVar4 != 3) goto LAB_004afae7;
    if (((ulong)*pbVar3 < 0x21) && ((0x100003601U >> ((ulong)*pbVar3 & 0x3f) & 1) != 0)) {
      pbVar3 = pbVar3 + 1;
      goto LAB_004afa8a;
    }
  }
LAB_004afad3:
  if (pbVar1 + uVar2 != pbVar3) {
    std::__cxx11::string::_M_erase((ulong)s,0);
    return s;
  }
LAB_004afae7:
  s->_M_string_length = 0;
  *pbVar1 = 0;
  return s;
}

Assistant:

static AI_FORCE_INLINE
std::string &Trim(std::string &s, bool newlines = true) {
    return TrimLeft(TrimRight(s, newlines), newlines);
}